

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O3

void middleOut(bool precompression,ifstream *sourceFile,ofstream *compressedFile)

{
  uint uVar1;
  size_t __n;
  _Alloc_hider _Var2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  string *this;
  long lVar8;
  Word *pWVar9;
  ulong uVar10;
  bool bVar11;
  string currentWord;
  Word newWord;
  char *local_288;
  size_t local_280;
  char local_278;
  undefined7 uStack_277;
  istream *local_268;
  ulong local_260;
  string local_258;
  Word local_238 [13];
  
  if ((*(uint *)(sourceFile + *(long *)(*(long *)sourceFile + -0x18) + 0x20) & 5) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"File not found... maybe use pipey");
    std::endl<char,std::char_traits<char>>(poVar4);
LAB_00103d20:
    exit(0);
  }
  if (precompression) {
    local_288 = &local_278;
    local_280 = 0;
    local_278 = '\0';
    if ((*(uint *)(sourceFile + *(long *)(*(long *)sourceFile + -0x18) + 0x20) & 2) == 0) {
      local_268 = (istream *)sourceFile;
      do {
        std::operator>>(local_268,(string *)&local_288);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_288,local_280);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data
            ._M_start) {
LAB_00103908:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Adding word",0xb);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,local_288,local_288 + local_280);
          Word::Word(local_238,&local_258,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          std::vector<Word,_std::allocator<Word>_>::push_back(&wordList,local_238);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._word._M_dataplus._M_p != &local_238[0]._word.field_2) {
            operator_delete(local_238[0]._word._M_dataplus._M_p,
                            local_238[0]._word.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          uVar10 = 0;
          uVar5 = 0;
          do {
            lVar8 = uVar10 * 0x28;
            local_260 = uVar5;
            while( true ) {
              Word::getWord_abi_cxx11_
                        (&local_238[0]._word,
                         (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->_word).
                                         _M_dataplus._M_p + lVar8));
              _Var2._M_p = local_238[0]._word._M_dataplus._M_p;
              if (local_280 == local_238[0]._word._M_string_length) {
                if (local_280 == 0) {
                  bVar11 = true;
                }
                else {
                  iVar3 = bcmp(local_288,local_238[0]._word._M_dataplus._M_p,local_280);
                  bVar11 = iVar3 == 0;
                }
              }
              else {
                bVar11 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var2._M_p != &local_238[0]._word.field_2) {
                operator_delete(_Var2._M_p,local_238[0]._word.field_2._M_allocated_capacity + 1);
              }
              if (bVar11) break;
              uVar10 = uVar10 + 1;
              uVar5 = ((long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
              lVar8 = lVar8 + 0x28;
              if (uVar5 < uVar10 || uVar5 - uVar10 == 0) {
                if ((local_260 & 1) != 0) goto LAB_00103a08;
                goto LAB_00103908;
              }
            }
            pWVar9 = (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->_word)._M_dataplus
                                     ._M_p + lVar8);
            iVar3 = Word::getFrequency(pWVar9);
            Word::setFrequency(pWVar9,iVar3 + 1);
            uVar10 = uVar10 + 1;
            uVar6 = ((long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
            uVar5 = 0xcccccccccccccc01;
          } while (uVar10 <= uVar6 && uVar6 - uVar10 != 0);
        }
LAB_00103a08:
      } while (((byte)local_268[*(long *)(*(long *)local_268 + -0x18) + 0x20] & 2) == 0);
    }
    if ((long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
              super__Vector_impl_data._M_start != 0x28) {
      lVar8 = 0;
      uVar5 = 0;
      do {
        iVar3 = Word::getFrequency((Word *)((long)&((wordList.
                                                  super__Vector_base<Word,_std::allocator<Word>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->_word).
                                                  _M_dataplus._M_p + lVar8));
        pWVar9 = (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                                   super__Vector_impl_data._M_start)->_word)._M_dataplus._M_p +
                         lVar8);
        if (maxCount < iVar3) {
          maxCount = Word::getFrequency(pWVar9);
          Word::getWord_abi_cxx11_
                    (&local_238[0]._word,
                     (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->_word)._M_dataplus
                                     ._M_p + lVar8));
          this = &maxWord_abi_cxx11_;
LAB_00103b09:
          std::__cxx11::string::operator=((string *)this,(string *)local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._word._M_dataplus._M_p != &local_238[0]._word.field_2) {
            operator_delete(local_238[0]._word._M_dataplus._M_p,
                            local_238[0]._word.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar3 = Word::getFrequency(pWVar9);
          pWVar9 = (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->_word)._M_dataplus.
                                   _M_p + lVar8);
          if (secondMaxCount < iVar3) {
            secondMaxCount = Word::getFrequency(pWVar9);
            Word::getWord_abi_cxx11_
                      (&local_238[0]._word,
                       (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->_word).
                                       _M_dataplus._M_p + lVar8));
            this = &secondMaxWord_abi_cxx11_;
            goto LAB_00103b09;
          }
          iVar3 = Word::getFrequency(pWVar9);
          if (thirdMaxCount < iVar3) {
            thirdMaxCount =
                 Word::getFrequency((Word *)((long)&((wordList.
                                                  super__Vector_base<Word,_std::allocator<Word>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->_word).
                                                  _M_dataplus._M_p + lVar8));
            Word::getWord_abi_cxx11_
                      (&local_238[0]._word,
                       (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->_word).
                                       _M_dataplus._M_p + lVar8));
            this = &thirdMaxWord_abi_cxx11_;
            goto LAB_00103b09;
          }
        }
        uVar5 = uVar5 + 1;
        lVar8 = lVar8 + 0x28;
      } while (uVar5 < ((long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - 1U);
    }
  }
  else {
    local_288 = &local_278;
    local_280 = 0;
    local_278 = '\0';
    std::ifstream::ifstream(local_238,"test.txt",_S_in);
    uVar1 = *(uint *)((long)&local_238[0]._frequency +
                     *(long *)(local_238[0]._word._M_dataplus._M_p + -0x18));
    if ((uVar1 & 5) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"File not found... maybe use pipey",0x21);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      goto LAB_00103d20;
    }
    if ((uVar1 & 2) == 0) {
      do {
        std::operator>>((istream *)local_238,(string *)&local_288);
        iVar3 = std::istream::peek();
        if (iVar3 == 10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)compressedFile,"\n",1);
        }
        __n = local_280;
        if (local_280 == maxWord_abi_cxx11_._M_string_length) {
          pcVar7 = " 1";
          if (local_280 != 0) {
            iVar3 = bcmp(local_288,maxWord_abi_cxx11_._M_dataplus._M_p,local_280);
            pcVar7 = " 1";
            if (iVar3 != 0) goto LAB_00103c1e;
          }
LAB_00103cad:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)compressedFile,pcVar7,2);
        }
        else {
LAB_00103c1e:
          if (__n == secondMaxWord_abi_cxx11_._M_string_length) {
            pcVar7 = " 2";
            if (__n != 0) {
              iVar3 = bcmp(local_288,secondMaxWord_abi_cxx11_._M_dataplus._M_p,__n);
              pcVar7 = " 2";
              if (iVar3 != 0) goto LAB_00103c4c;
            }
            goto LAB_00103cad;
          }
LAB_00103c4c:
          if (__n == thirdMaxWord_abi_cxx11_._M_string_length) {
            pcVar7 = " 3";
            if (__n != 0) {
              iVar3 = bcmp(local_288,thirdMaxWord_abi_cxx11_._M_dataplus._M_p,__n);
              pcVar7 = " 3";
              if (iVar3 != 0) goto LAB_00103c86;
            }
            goto LAB_00103cad;
          }
LAB_00103c86:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)compressedFile," ",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)compressedFile,local_288,local_280);
        }
      } while ((*(byte *)((long)&local_238[0]._frequency +
                         *(long *)(local_238[0]._word._M_dataplus._M_p + -0x18)) & 2) == 0);
    }
    std::ifstream::~ifstream(local_238);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  return;
}

Assistant:

void middleOut(bool precompression,  ifstream &sourceFile, ofstream &compressedFile)
{

    // Ensure the source file is opened properly again
    if(sourceFile.fail())
    {
        cerr << "File not found... maybe use pipey"<< endl;
        exit(0);

    }

    // If just parsing logic is different than compressing
    if (precompression)
    {
        // Read each word in one at a time until at end of file
        string currentWord;

        while (!sourceFile.eof())
        {
            // Boolean for tracking if a word is in list already or not
            bool wordMatch = false;
            // Read current word
            sourceFile >> currentWord;
            // Debugging
            cout << currentWord << endl;

            // Loop through every word in the list of seen words and check if current word is a match
            for (int i = 0; i < wordList.size(); i++)
            {
                // If it matches word in list already set match flag to true and add plus one to frequency count of that
                // specific word frequency

                if (currentWord == wordList[i].getWord())
                {
                    wordMatch = true;
                    wordList[i].setFrequency((wordList[i].getFrequency()) + 1);
                }
            }

            // If matching flag was never set indicating non of the words in the vector are the current word than
            // save a new Word object using the current word as paramater for construction
            if (!wordMatch)
            {
                cout << "Adding word" << endl;
                // New word object with current word name and 1 as starting frequency
                Word newWord(currentWord, 1);

                // Add to back of word vector
                wordList.push_back(newWord);
                //Debugging
                cout << wordList.size() << endl;

            }

        }

        // For all words in the saved wordlist get top three most frequent ones and save to global variables
        for (int i = 0; i < wordList.size()-1; i++)
        {
            // Max word biggest bang for your buck
            if (wordList[i].getFrequency() > maxCount)
            {
                maxCount = wordList[i].getFrequency();
                maxWord = wordList[i].getWord();
            }

            // Second most common
            else if (wordList[i].getFrequency()> secondMaxCount)
            {
                // Store seccond most common
                secondMaxCount = wordList[i].getFrequency();
                secondMaxWord = wordList[i].getWord();

            }
            // Third most common
            else if (wordList[i].getFrequency() > thirdMaxCount)
            {
                thirdMaxCount  = wordList[i].getFrequency();
                thirdMaxWord = wordList[i].getWord();

            }
        }
    }

    // If not precompressing actually compress
    else
    {
        // Compress the file actually

        string currentWord;

        // Reload file and ensure it opens properly
        ifstream loadFile("test.txt");
        if (loadFile.fail())
        {
            cerr << "File not found... maybe use pipey"<< endl;
            exit(0);
        }

        // Read every word in source one at a time and replace if matches top 3
        while (!loadFile.eof())
        {

            loadFile >> currentWord;
            // Check current char to determin when to save a new line in compressed.pra
            if (loadFile.peek() == '\n')
            {
                compressedFile << "\n";
            }

            // Check for top 3 matching words if found replace with mapping byte
            if (currentWord == maxWord)
            {
                compressedFile << " 1";

            }
            else if (currentWord == secondMaxWord)
            {
                compressedFile << " 2";
            }
            else if (currentWord == thirdMaxWord)
            {
                compressedFile << " 3";
            }

            // If the word doesnt match the top 3 simple save it as is to the compressed.pra file
            else
            {
                compressedFile << " " << currentWord;
            }
        }
    }


}